

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_numbox.c
# Opt level: O3

void my_numbox_key(void *z,t_symbol *keysym,t_floatarg fkey)

{
  uint uVar1;
  size_t sVar2;
  int iVar3;
  ulong uVar4;
  char cVar5;
  float fVar6;
  double dVar7;
  char buf [3];
  char local_1b [3];
  
  local_1b[1] = 0;
  cVar5 = (char)(int)fkey;
  if (cVar5 == '\0') {
    *(byte *)((long)z + 0x443) = *(byte *)((long)z + 0x443) & 0xf7;
    goto LAB_0014e580;
  }
  if (9 < (byte)(cVar5 - 0x30U)) {
    uVar1 = (int)fkey & 0xff;
    uVar4 = (ulong)(uVar1 - 8);
    if (uVar1 - 8 < 0x3e) {
      if ((0x2000006800000000U >> (uVar4 & 0x3f) & 1) == 0) {
        if ((0x24UL >> (uVar4 & 0x3f) & 1) != 0) {
          if (*(char *)((long)z + 0x4c4) != '\0') {
            dVar7 = atof((char *)((long)z + 0x4c4));
            *(float *)((long)z + 0x4a0) = (float)dVar7;
            *(undefined1 *)((long)z + 0x4c4) = 0;
            if (pd_compatibilitylevel < 0x35) {
              dVar7 = (double)(float)dVar7;
              if (dVar7 < *(double *)((long)z + 0x4a8)) {
                fVar6 = (float)*(double *)((long)z + 0x4a8);
                *(float *)((long)z + 0x4a0) = fVar6;
                dVar7 = (double)fVar6;
              }
              if (*(double *)((long)z + 0x4b0) < dVar7) {
                *(float *)((long)z + 0x4a0) = (float)*(double *)((long)z + 0x4b0);
              }
            }
            sys_queuegui(z,*(_glist **)((long)z + 0x30),my_numbox_draw_update);
          }
          my_numbox_bang((t_my_numbox *)z);
          return;
        }
        if (uVar4 != 0) goto LAB_0014e64e;
        goto LAB_0014e666;
      }
    }
    else {
LAB_0014e64e:
      if (uVar1 == 0x7f) {
LAB_0014e666:
        sVar2 = strlen((char *)((long)z + 0x4c4));
        iVar3 = 1;
        if (1 < (int)sVar2) {
          iVar3 = (int)sVar2;
        }
        *(undefined1 *)((long)z + (ulong)(iVar3 - 1) + 0x4c4) = 0;
        goto LAB_0014e580;
      }
      if (uVar1 != 0x65) {
        return;
      }
    }
  }
  sVar2 = strlen((char *)((long)z + 0x4c4));
  if (0x1d < sVar2) {
    return;
  }
  local_1b[0] = cVar5;
  strcat((char *)((long)z + 0x4c4),local_1b);
LAB_0014e580:
  sys_queuegui(z,*(_glist **)((long)z + 0x30),my_numbox_draw_update);
  return;
}

Assistant:

static void my_numbox_key(void *z, t_symbol *keysym, t_floatarg fkey)
{
    t_my_numbox *x = z;
    char c = fkey;
    char buf[3];
    buf[1] = 0;

    if(c == 0)
    {
        x->x_gui.x_fsf.x_change = 0;
        sys_queuegui(x, x->x_gui.x_glist, my_numbox_draw_update);
        return;
    }
    if(((c >= '0') && (c <= '9')) || (c == '.') || (c == '-') ||
        (c == 'e') || (c == '+') || (c == 'E'))
    {
        if(strlen(x->x_buf) < (IEMGUI_MAX_NUM_LEN-2))
        {
            buf[0] = c;
            strcat(x->x_buf, buf);
            sys_queuegui(x, x->x_gui.x_glist, my_numbox_draw_update);
        }
    }
    else if((c == '\b') || (c == 127))
    {
        int sl = (int)strlen(x->x_buf) - 1;

        if(sl < 0)
            sl = 0;
        x->x_buf[sl] = 0;
        sys_queuegui(x, x->x_gui.x_glist, my_numbox_draw_update);
    }
    else if((c == '\n') || (c == 13))
    {
        if(x->x_buf[0])
        {
            x->x_val = atof(x->x_buf);
            x->x_buf[0] = 0;
            if (pd_compatibilitylevel < 53)
                my_numbox_clip(x);
            sys_queuegui(x, x->x_gui.x_glist, my_numbox_draw_update);
        }
        my_numbox_bang(x);
    }
}